

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

int phrase(gdstate *gds)

{
  int iVar1;
  gdstate *gds_local;
  
  iVar1 = timephrase(gds);
  if (iVar1 == 0) {
    iVar1 = zonephrase(gds);
    if (iVar1 == 0) {
      iVar1 = datephrase(gds);
      if (iVar1 == 0) {
        iVar1 = dayphrase(gds);
        if (iVar1 == 0) {
          iVar1 = relunitphrase(gds);
          if (iVar1 == 0) {
            if (gds->tokenp->token == 0x10b) {
              if (((gds->HaveTime != 0) && (gds->HaveYear == 0)) && (gds->HaveRel == 0)) {
                gds->HaveYear = gds->HaveYear + 1;
                gds->Year = gds->tokenp->value;
                gds->tokenp = gds->tokenp + 1;
                return 1;
              }
              if (10000 < gds->tokenp->value) {
                gds->HaveYear = gds->HaveYear + 1;
                gds->HaveMonth = gds->HaveMonth + 1;
                gds->HaveDay = gds->HaveDay + 1;
                gds->Day = gds->tokenp->value % 100;
                gds->Month = (gds->tokenp->value / 100) % 100;
                gds->Year = gds->tokenp->value / 10000;
                gds->tokenp = gds->tokenp + 1;
                return 1;
              }
              if (gds->tokenp->value < 0x18) {
                gds->HaveTime = gds->HaveTime + 1;
                gds->Hour = gds->tokenp->value;
                gds->Minutes = 0;
                gds->Seconds = 0;
                gds->tokenp = gds->tokenp + 1;
                return 1;
              }
              if ((gds->tokenp->value / 100 < 0x18) && (gds->tokenp->value % 100 < 0x3c)) {
                gds->Hour = gds->tokenp->value / 100;
                gds->Minutes = gds->tokenp->value % 100;
                gds->Seconds = 0;
                gds->tokenp = gds->tokenp + 1;
                return 1;
              }
            }
            gds_local._4_4_ = 0;
          }
          else {
            if (gds->tokenp->token == 0x104) {
              gds->RelSeconds = -gds->RelSeconds;
              gds->RelMonth = -gds->RelMonth;
              gds->tokenp = gds->tokenp + 1;
            }
            gds_local._4_4_ = 1;
          }
        }
        else {
          gds_local._4_4_ = 1;
        }
      }
      else {
        gds_local._4_4_ = 1;
      }
    }
    else {
      gds_local._4_4_ = 1;
    }
  }
  else {
    gds_local._4_4_ = 1;
  }
  return gds_local._4_4_;
}

Assistant:

static int
phrase(struct gdstate *gds)
{
	if (timephrase(gds))
		return 1;
	if (zonephrase(gds))
		return 1;
	if (datephrase(gds))
		return 1;
	if (dayphrase(gds))
		return 1;
	if (relunitphrase(gds)) {
		if (gds->tokenp[0].token == tAGO) {
			gds->RelSeconds = -gds->RelSeconds;
			gds->RelMonth = -gds->RelMonth;
			gds->tokenp += 1;
		}
		return 1;
	}

	/* Bare numbers sometimes have meaning. */
	if (gds->tokenp[0].token == tUNUMBER) {
		if (gds->HaveTime && !gds->HaveYear && !gds->HaveRel) {
			gds->HaveYear++;
			gds->Year = gds->tokenp[0].value;
			gds->tokenp += 1;
			return 1;
		}

		if(gds->tokenp[0].value > 10000) {
			/* "20040301" */
			gds->HaveYear++;
			gds->HaveMonth++;
			gds->HaveDay++;
			gds->Day= (gds->tokenp[0].value)%100;
			gds->Month= (gds->tokenp[0].value/100)%100;
			gds->Year = gds->tokenp[0].value/10000;
			gds->tokenp += 1;
			return 1;
		}

		if (gds->tokenp[0].value < 24) {
			gds->HaveTime++;
			gds->Hour = gds->tokenp[0].value;
			gds->Minutes = 0;
			gds->Seconds = 0;
			gds->tokenp += 1;
			return 1;
		}

		if ((gds->tokenp[0].value / 100 < 24)
		    && (gds->tokenp[0].value % 100 < 60)) {
			/* "513" is same as "5:13" */
			gds->Hour = gds->tokenp[0].value / 100;
			gds->Minutes = gds->tokenp[0].value % 100;
			gds->Seconds = 0;
			gds->tokenp += 1;
			return 1;
		}
	}

	return 0;
}